

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption
          (OptionInterpreter *this,Message *options,vector<int,_std::allocator<int>_> *src_path,
          vector<int,_std::allocator<int>_> *options_path)

{
  pointer ppFVar1;
  DescriptorBuilder *this_00;
  FieldDescriptor *innermost_field;
  Message *message;
  unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
  __p;
  bool bVar2;
  int iVar3;
  CppType CVar4;
  Type TVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LogMessage *pLVar6;
  void *pvVar7;
  anon_union_8_8_13f84498_for_Symbol_2 aVar8;
  anon_union_8_8_13f84498_for_Symbol_2 this_01;
  UnknownFieldSet *pUVar9;
  string *psVar10;
  mapped_type *pmVar11;
  mapped_type *this_02;
  Reflection *this_03;
  Reflection *this_04;
  long lVar12;
  anon_union_8_8_13f84498_for_Symbol_2 this_05;
  pointer ppFVar13;
  Symbol SVar14;
  FieldDescriptor *field;
  Message *local_1b8;
  CodedOutputStream out;
  LogMessage local_160;
  unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
  unknown_fields;
  string debug_msg_name;
  StringOutputStream outstr;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  intermediate_fields;
  unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
  parent_unknown_fields;
  vector<int,_std::allocator<int>_> dest_path;
  undefined1 local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->uninterpreted_option_->name_).super_RepeatedPtrFieldBase.current_size_ == 0) {
    std::__cxx11::string::string((string *)&out,"Option must have a name.",(allocator *)&local_160);
    bVar2 = AddNameError(this,(string *)&out);
LAB_0029bff2:
    std::__cxx11::string::~string((string *)&out);
    return bVar2;
  }
  bVar2 = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                           ((long)((this->uninterpreted_option_->name_).super_RepeatedPtrFieldBase.
                                  rep_)->elements[0] + 0x18),"uninterpreted_option");
  if (bVar2) {
    std::__cxx11::string::string
              ((string *)&out,"Option must not use reserved name \"uninterpreted_option\".",
               (allocator *)&local_160);
    bVar2 = AddNameError(this,(string *)&out);
    goto LAB_0029bff2;
  }
  this_00 = this->builder_;
  iVar3 = (*(options->super_MessageLite)._vptr_MessageLite[0x15])(options);
  SVar14 = FindSymbolNotEnforcingDeps(this_00,*(string **)(CONCAT44(extraout_var,iVar3) + 8),true);
  this_01 = SVar14.field_1;
  if (SVar14.type != MESSAGE) {
    this_01._0_4_ = (*(options->super_MessageLite)._vptr_MessageLite[0x15])(options);
    this_01._4_4_ = extraout_var_00;
  }
  local_1b8 = options;
  if ((DescriptorBuilder *)this_01.descriptor == (DescriptorBuilder *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&out,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
               ,0x18e5);
    pLVar6 = internal::LogMessage::operator<<
                       ((LogMessage *)&out,"CHECK failed: options_descriptor: ");
    internal::LogFinisher::operator=((LogFinisher *)&local_160,pLVar6);
    internal::LogMessage::~LogMessage((LogMessage *)&out);
  }
  field = (FieldDescriptor *)0x0;
  intermediate_fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  intermediate_fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  intermediate_fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string
            ((string *)&debug_msg_name,anon_var_dwarf_350436 + 0x11,(allocator *)&out);
  std::vector<int,_std::allocator<int>_>::vector(&dest_path,options_path);
  for (lVar12 = 0;
      ppFVar1 = intermediate_fields.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish,
      ppFVar13 = intermediate_fields.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start, innermost_field = field,
      lVar12 < (this->uninterpreted_option_->name_).super_RepeatedPtrFieldBase.current_size_;
      lVar12 = lVar12 + 1) {
    pvVar7 = ((this->uninterpreted_option_->name_).super_RepeatedPtrFieldBase.rep_)->elements
             [lVar12];
    psVar10 = *(string **)((long)pvVar7 + 0x18);
    if (debug_msg_name._M_string_length != 0) {
      std::__cxx11::string::append((char *)&debug_msg_name);
      pvVar7 = ((this->uninterpreted_option_->name_).super_RepeatedPtrFieldBase.rep_)->elements
               [lVar12];
    }
    if (*(char *)((long)pvVar7 + 0x20) == '\x01') {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_160
                     ,"(",psVar10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_160
                     ,")");
      std::__cxx11::string::append((string *)&debug_msg_name);
      std::__cxx11::string::~string((string *)&out);
      std::__cxx11::string::~string((string *)&local_160);
      this_05 = (anon_union_8_8_13f84498_for_Symbol_2)this->builder_;
      SVar14 = LookupSymbol((DescriptorBuilder *)this_05.descriptor,psVar10,
                            &this->options_to_interpret_->name_scope,PLACEHOLDER_MESSAGE,LOOKUP_ALL,
                            true);
      aVar8 = SVar14.field_1;
      if (SVar14.type != FIELD) {
        aVar8.field_descriptor = field;
      }
    }
    else {
      std::__cxx11::string::append((string *)&debug_msg_name);
      this_05 = this_01;
      aVar8.field_descriptor = Descriptor::FindFieldByName(this_01.descriptor,psVar10);
    }
    field = aVar8.field_descriptor;
    if (field == (FieldDescriptor *)0x0) {
      if (this->builder_->pool_->allow_unknown_ == true) {
LAB_0029c592:
        bVar2 = true;
        AddWithoutInterpreting
                  ((OptionInterpreter *)this_05.descriptor,this->uninterpreted_option_,local_1b8);
      }
      else {
        if ((this->builder_->undefine_resolved_name_)._M_string_length == 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &outstr,"Option \"",&debug_msg_name);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_160,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &outstr,"\" unknown. Ensure that your proto");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_160," definition file imports the proto which defines the option.");
          bVar2 = AddNameError(this,(string *)&out);
          std::__cxx11::string::~string((string *)&out);
          std::__cxx11::string::~string((string *)&local_160);
          pLVar6 = (LogMessage *)&outstr;
        }
        else {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_70,"Option \"",&debug_msg_name);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &parent_unknown_fields,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_70,"\" is resolved to \"(");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &unknown_fields,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &parent_unknown_fields,&this->builder_->undefine_resolved_name_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &outstr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&unknown_fields,
                         ")\", which is not defined. The innermost scope is searched first in name resolution. Consider using a leading \'.\'(i.e., \"(."
                        );
          std::__cxx11::string::substr((ulong)(local_70 + 0x20),(ulong)&debug_msg_name);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_160,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &outstr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_70 + 0x20));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_160,"\") to start from the outermost scope.");
          bVar2 = AddNameError(this,(string *)&out);
          std::__cxx11::string::~string((string *)&out);
          std::__cxx11::string::~string((string *)&local_160);
          std::__cxx11::string::~string((string *)(local_70 + 0x20));
          std::__cxx11::string::~string((string *)&outstr);
          std::__cxx11::string::~string((string *)&unknown_fields);
          std::__cxx11::string::~string((string *)&parent_unknown_fields);
          pLVar6 = (LogMessage *)local_70;
        }
LAB_0029c6d3:
        std::__cxx11::string::~string((string *)pLVar6);
      }
      goto LAB_0029c85b;
    }
    if (*(DescriptorBuilder **)(field + 0x50) != (DescriptorBuilder *)this_01.descriptor) {
      if (*(char *)&((*(DescriptorBuilder **)(field + 0x50))->dependencies_)._M_t._M_impl.
                    super__Rb_tree_header._M_header._M_right != '\0') goto LAB_0029c592;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &unknown_fields,"Option field \"",&debug_msg_name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outstr,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &unknown_fields,"\" is not a field or extension of message \"");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_160
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outstr,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      this_01.descriptor);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_160
                     ,"\".");
      bVar2 = AddNameError(this,(string *)&out);
      std::__cxx11::string::~string((string *)&out);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&outstr);
      pLVar6 = (LogMessage *)&unknown_fields;
      goto LAB_0029c6d3;
    }
    out.impl_.end_._0_4_ = *(int *)(field + 0x44);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&dest_path,(int *)&out);
    if (lVar12 < (long)(this->uninterpreted_option_->name_).super_RepeatedPtrFieldBase.current_size_
                 + -1) {
      CVar4 = FieldDescriptor::cpp_type(field);
      if (CVar4 == CPPTYPE_MESSAGE) {
        if (*(int *)(field + 0x3c) != 3) {
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::push_back(&intermediate_fields,&field);
          this_01.descriptor = FieldDescriptor::message_type(field);
          goto LAB_0029c234;
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_160,"Option field \"",&debug_msg_name);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_160,
                       "\" is a repeated message. Repeated message options must be initialized using an aggregate value."
                      );
        bVar2 = AddNameError(this,(string *)&out);
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_160,"Option \"",&debug_msg_name);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_160,"\" is an atomic type, not a message.");
        bVar2 = AddNameError(this,(string *)&out);
      }
      std::__cxx11::string::~string((string *)&out);
      pLVar6 = &local_160;
      goto LAB_0029c6d3;
    }
LAB_0029c234:
  }
  if (*(int *)(field + 0x3c) != 3) {
    (*(local_1b8->super_MessageLite)._vptr_MessageLite[0x15])();
    pUVar9 = Reflection::GetUnknownFields(this_03,local_1b8);
    bVar2 = ExamineIfOptionIsSet
                      (this,(const_iterator)ppFVar13,(const_iterator)ppFVar1,innermost_field,
                       &debug_msg_name,pUVar9);
    if (!bVar2) {
      bVar2 = false;
      goto LAB_0029c85b;
    }
  }
  unknown_fields._M_t.
  super___uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::UnknownFieldSet_*,_std::default_delete<google::protobuf::UnknownFieldSet>_>
  .super__Head_base<0UL,_google::protobuf::UnknownFieldSet_*,_false>._M_head_impl =
       (__uniq_ptr_data<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>,_true,_true>
        )operator_new(0x18);
  *(pointer *)
   ((long)unknown_fields._M_t.
          super___uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
          ._M_t.
          super__Tuple_impl<0UL,_google::protobuf::UnknownFieldSet_*,_std::default_delete<google::protobuf::UnknownFieldSet>_>
          .super__Head_base<0UL,_google::protobuf::UnknownFieldSet_*,_false>._M_head_impl + 0x10) =
       (pointer)0x0;
  *(undefined8 *)
   unknown_fields._M_t.
   super___uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
   ._M_t.
   super__Tuple_impl<0UL,_google::protobuf::UnknownFieldSet_*,_std::default_delete<google::protobuf::UnknownFieldSet>_>
   .super__Head_base<0UL,_google::protobuf::UnknownFieldSet_*,_false>._M_head_impl = 0;
  *(pointer *)
   ((long)unknown_fields._M_t.
          super___uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
          ._M_t.
          super__Tuple_impl<0UL,_google::protobuf::UnknownFieldSet_*,_std::default_delete<google::protobuf::UnknownFieldSet>_>
          .super__Head_base<0UL,_google::protobuf::UnknownFieldSet_*,_false>._M_head_impl + 8) =
       (pointer)0x0;
  bVar2 = SetOptionValue(this,field,
                         (UnknownFieldSet *)
                         unknown_fields._M_t.
                         super___uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_google::protobuf::UnknownFieldSet_*,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                         .super__Head_base<0UL,_google::protobuf::UnknownFieldSet_*,_false>.
                         _M_head_impl);
  if (bVar2) {
    ppFVar13 = intermediate_fields.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    while (message = local_1b8,
          ppFVar13 !=
          intermediate_fields.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_start) {
      parent_unknown_fields._M_t.
      super___uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::UnknownFieldSet_*,_std::default_delete<google::protobuf::UnknownFieldSet>_>
      .super__Head_base<0UL,_google::protobuf::UnknownFieldSet_*,_false>._M_head_impl =
           (__uniq_ptr_data<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>,_true,_true>
            )operator_new(0x18);
      *(undefined8 *)
       ((long)parent_unknown_fields._M_t.
              super___uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
              ._M_t.
              super__Tuple_impl<0UL,_google::protobuf::UnknownFieldSet_*,_std::default_delete<google::protobuf::UnknownFieldSet>_>
              .super__Head_base<0UL,_google::protobuf::UnknownFieldSet_*,_false>._M_head_impl + 0x10
       ) = 0;
      *(undefined8 *)
       parent_unknown_fields._M_t.
       super___uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
       ._M_t.
       super__Tuple_impl<0UL,_google::protobuf::UnknownFieldSet_*,_std::default_delete<google::protobuf::UnknownFieldSet>_>
       .super__Head_base<0UL,_google::protobuf::UnknownFieldSet_*,_false>._M_head_impl = 0;
      *(undefined8 *)
       ((long)parent_unknown_fields._M_t.
              super___uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
              ._M_t.
              super__Tuple_impl<0UL,_google::protobuf::UnknownFieldSet_*,_std::default_delete<google::protobuf::UnknownFieldSet>_>
              .super__Head_base<0UL,_google::protobuf::UnknownFieldSet_*,_false>._M_head_impl + 8) =
           0;
      TVar5 = FieldDescriptor::type(ppFVar13[-1]);
      ppFVar1 = ppFVar13 + -1;
      if (TVar5 == TYPE_GROUP) {
        pUVar9 = UnknownFieldSet::AddGroup
                           ((UnknownFieldSet *)
                            parent_unknown_fields._M_t.
                            super___uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::UnknownFieldSet_*,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                            .super__Head_base<0UL,_google::protobuf::UnknownFieldSet_*,_false>.
                            _M_head_impl,*(int *)(*ppFVar1 + 0x44));
        UnknownFieldSet::MergeFrom
                  (pUVar9,(UnknownFieldSet *)
                          unknown_fields._M_t.
                          super___uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_google::protobuf::UnknownFieldSet_*,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                          .super__Head_base<0UL,_google::protobuf::UnknownFieldSet_*,_false>.
                          _M_head_impl);
      }
      else {
        if (TVar5 != TYPE_MESSAGE) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)&out,LOGLEVEL_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
                     ,0x197c);
          pLVar6 = internal::LogMessage::operator<<
                             ((LogMessage *)&out,"Invalid wire type for CPPTYPE_MESSAGE: ");
          TVar5 = FieldDescriptor::type(ppFVar13[-1]);
          pLVar6 = internal::LogMessage::operator<<(pLVar6,TVar5);
          internal::LogFinisher::operator=((LogFinisher *)&local_160,pLVar6);
          internal::LogMessage::~LogMessage((LogMessage *)&out);
          std::
          unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
          ::~unique_ptr(&parent_unknown_fields);
          goto LAB_0029c84c;
        }
        psVar10 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_
                            ((UnknownFieldSet *)
                             parent_unknown_fields._M_t.
                             super___uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_google::protobuf::UnknownFieldSet_*,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                             .super__Head_base<0UL,_google::protobuf::UnknownFieldSet_*,_false>.
                             _M_head_impl,*(int *)(*ppFVar1 + 0x44));
        io::StringOutputStream::StringOutputStream(&outstr,psVar10);
        io::CodedOutputStream::CodedOutputStream(&out,&outstr.super_ZeroCopyOutputStream);
        internal::WireFormat::SerializeUnknownFields
                  ((UnknownFieldSet *)
                   unknown_fields._M_t.
                   super___uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::UnknownFieldSet_*,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                   .super__Head_base<0UL,_google::protobuf::UnknownFieldSet_*,_false>._M_head_impl,
                   &out);
        bVar2 = io::CodedOutputStream::HadError(&out);
        if (bVar2) {
          internal::LogMessage::LogMessage
                    (&local_160,LOGLEVEL_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
                     ,0x196f);
          pLVar6 = internal::LogMessage::operator<<(&local_160,"CHECK failed: !out.HadError(): ");
          pLVar6 = internal::LogMessage::operator<<
                             (pLVar6,"Unexpected failure while serializing option submessage ");
          pLVar6 = internal::LogMessage::operator<<(pLVar6,&debug_msg_name);
          pLVar6 = internal::LogMessage::operator<<(pLVar6,"\".");
          internal::LogFinisher::operator=((LogFinisher *)local_70,pLVar6);
          internal::LogMessage::~LogMessage(&local_160);
        }
        io::CodedOutputStream::~CodedOutputStream(&out);
      }
      __p._M_t.
      super___uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::UnknownFieldSet_*,_std::default_delete<google::protobuf::UnknownFieldSet>_>
      .super__Head_base<0UL,_google::protobuf::UnknownFieldSet_*,_false>._M_head_impl =
           parent_unknown_fields._M_t.
           super___uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::UnknownFieldSet_*,_std::default_delete<google::protobuf::UnknownFieldSet>_>
           .super__Head_base<0UL,_google::protobuf::UnknownFieldSet_*,_false>._M_head_impl;
      parent_unknown_fields._M_t.
      super___uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::UnknownFieldSet_*,_std::default_delete<google::protobuf::UnknownFieldSet>_>
      .super__Head_base<0UL,_google::protobuf::UnknownFieldSet_*,_false>._M_head_impl =
           (__uniq_ptr_data<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>,_true,_true>
            )(__uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
              )0x0;
      std::
      __uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
      ::reset((__uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
               *)&unknown_fields,
              (pointer)__p._M_t.
                       super___uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_google::protobuf::UnknownFieldSet_*,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                       .super__Head_base<0UL,_google::protobuf::UnknownFieldSet_*,_false>.
                       _M_head_impl);
      std::
      unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
      ::~unique_ptr(&parent_unknown_fields);
      ppFVar13 = ppFVar1;
    }
    (*(local_1b8->super_MessageLite)._vptr_MessageLite[0x15])(local_1b8);
    pUVar9 = Reflection::MutableUnknownFields(this_04,message);
    UnknownFieldSet::MergeFrom
              (pUVar9,(UnknownFieldSet *)
                      unknown_fields._M_t.
                      super___uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::UnknownFieldSet_*,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                      .super__Head_base<0UL,_google::protobuf::UnknownFieldSet_*,_false>.
                      _M_head_impl);
    if (*(int *)(field + 0x3c) == 3) {
      pmVar11 = std::
                map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                ::operator[](&this->repeated_option_counts_,&dest_path);
      out.impl_.end_._0_4_ = *pmVar11;
      *pmVar11 = (int)out.impl_.end_ + 1;
      std::vector<int,_std::allocator<int>_>::push_back(&dest_path,(value_type_conflict2 *)&out);
    }
    this_02 = std::
              map<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator[](&this->interpreted_paths_,src_path);
    bVar2 = true;
    std::vector<int,_std::allocator<int>_>::operator=(this_02,&dest_path);
  }
  else {
LAB_0029c84c:
    bVar2 = false;
  }
  std::
  unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
  ::~unique_ptr(&unknown_fields);
LAB_0029c85b:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&dest_path.super__Vector_base<int,_std::allocator<int>_>);
  std::__cxx11::string::~string((string *)&debug_msg_name);
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&intermediate_fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 );
  return bVar2;
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::InterpretSingleOption(
    Message* options, const std::vector<int>& src_path,
    const std::vector<int>& options_path) {
  // First do some basic validation.
  if (uninterpreted_option_->name_size() == 0) {
    // This should never happen unless the parser has gone seriously awry or
    // someone has manually created the uninterpreted option badly.
    return AddNameError("Option must have a name.");
  }
  if (uninterpreted_option_->name(0).name_part() == "uninterpreted_option") {
    return AddNameError(
        "Option must not use reserved name "
        "\"uninterpreted_option\".");
  }

  const Descriptor* options_descriptor = nullptr;
  // Get the options message's descriptor from the builder's pool, so that we
  // get the version that knows about any extension options declared in the file
  // we're currently building. The descriptor should be there as long as the
  // file we're building imported descriptor.proto.

  // Note that we use DescriptorBuilder::FindSymbolNotEnforcingDeps(), not
  // DescriptorPool::FindMessageTypeByName() because we're already holding the
  // pool's mutex, and the latter method locks it again.  We don't use
  // FindSymbol() because files that use custom options only need to depend on
  // the file that defines the option, not descriptor.proto itself.
  Symbol symbol = builder_->FindSymbolNotEnforcingDeps(
      options->GetDescriptor()->full_name());
  if (!symbol.IsNull() && symbol.type == Symbol::MESSAGE) {
    options_descriptor = symbol.descriptor;
  } else {
    // The options message's descriptor was not in the builder's pool, so use
    // the standard version from the generated pool. We're not holding the
    // generated pool's mutex, so we can search it the straightforward way.
    options_descriptor = options->GetDescriptor();
  }
  GOOGLE_CHECK(options_descriptor);

  // We iterate over the name parts to drill into the submessages until we find
  // the leaf field for the option. As we drill down we remember the current
  // submessage's descriptor in |descriptor| and the next field in that
  // submessage in |field|. We also track the fields we're drilling down
  // through in |intermediate_fields|. As we go, we reconstruct the full option
  // name in |debug_msg_name|, for use in error messages.
  const Descriptor* descriptor = options_descriptor;
  const FieldDescriptor* field = nullptr;
  std::vector<const FieldDescriptor*> intermediate_fields;
  std::string debug_msg_name = "";

  std::vector<int> dest_path = options_path;

  for (int i = 0; i < uninterpreted_option_->name_size(); ++i) {
    const std::string& name_part = uninterpreted_option_->name(i).name_part();
    if (debug_msg_name.size() > 0) {
      debug_msg_name += ".";
    }
    if (uninterpreted_option_->name(i).is_extension()) {
      debug_msg_name += "(" + name_part + ")";
      // Search for the extension's descriptor as an extension in the builder's
      // pool. Note that we use DescriptorBuilder::LookupSymbol(), not
      // DescriptorPool::FindExtensionByName(), for two reasons: 1) It allows
      // relative lookups, and 2) because we're already holding the pool's
      // mutex, and the latter method locks it again.
      symbol =
          builder_->LookupSymbol(name_part, options_to_interpret_->name_scope);
      if (!symbol.IsNull() && symbol.type == Symbol::FIELD) {
        field = symbol.field_descriptor;
      }
      // If we don't find the field then the field's descriptor was not in the
      // builder's pool, but there's no point in looking in the generated
      // pool. We require that you import the file that defines any extensions
      // you use, so they must be present in the builder's pool.
    } else {
      debug_msg_name += name_part;
      // Search for the field's descriptor as a regular field.
      field = descriptor->FindFieldByName(name_part);
    }

    if (field == nullptr) {
      if (get_allow_unknown(builder_->pool_)) {
        // We can't find the option, but AllowUnknownDependencies() is enabled,
        // so we will just leave it as uninterpreted.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else if (!(builder_->undefine_resolved_name_).empty()) {
        // Option is resolved to a name which is not defined.
        return AddNameError(
            "Option \"" + debug_msg_name + "\" is resolved to \"(" +
            builder_->undefine_resolved_name_ +
            ")\", which is not defined. The innermost scope is searched first "
            "in name resolution. Consider using a leading '.'(i.e., \"(." +
            debug_msg_name.substr(1) +
            "\") to start from the outermost scope.");
      } else {
        return AddNameError(
            "Option \"" + debug_msg_name +
            "\" unknown. Ensure that your proto" +
            " definition file imports the proto which defines the option.");
      }
    } else if (field->containing_type() != descriptor) {
      if (get_is_placeholder(field->containing_type())) {
        // The field is an extension of a placeholder type, so we can't
        // reliably verify whether it is a valid extension to use here (e.g.
        // we don't know if it is an extension of the correct *Options message,
        // or if it has a valid field number, etc.).  Just leave it as
        // uninterpreted instead.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else {
        // This can only happen if, due to some insane misconfiguration of the
        // pools, we find the options message in one pool but the field in
        // another. This would probably imply a hefty bug somewhere.
        return AddNameError("Option field \"" + debug_msg_name +
                            "\" is not a field or extension of message \"" +
                            descriptor->name() + "\".");
      }
    } else {
      // accumulate field numbers to form path to interpreted option
      dest_path.push_back(field->number());

      if (i < uninterpreted_option_->name_size() - 1) {
        if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
          return AddNameError("Option \"" + debug_msg_name +
                              "\" is an atomic type, not a message.");
        } else if (field->is_repeated()) {
          return AddNameError("Option field \"" + debug_msg_name +
                              "\" is a repeated message. Repeated message "
                              "options must be initialized using an "
                              "aggregate value.");
        } else {
          // Drill down into the submessage.
          intermediate_fields.push_back(field);
          descriptor = field->message_type();
        }
      }
    }
  }

  // We've found the leaf field. Now we use UnknownFieldSets to set its value
  // on the options message. We do so because the message may not yet know
  // about its extension fields, so we may not be able to set the fields
  // directly. But the UnknownFieldSets will serialize to the same wire-format
  // message, so reading that message back in once the extension fields are
  // known will populate them correctly.

  // First see if the option is already set.
  if (!field->is_repeated() &&
      !ExamineIfOptionIsSet(
          intermediate_fields.begin(), intermediate_fields.end(), field,
          debug_msg_name,
          options->GetReflection()->GetUnknownFields(*options))) {
    return false;  // ExamineIfOptionIsSet() already added the error.
  }

  // First set the value on the UnknownFieldSet corresponding to the
  // innermost message.
  std::unique_ptr<UnknownFieldSet> unknown_fields(new UnknownFieldSet());
  if (!SetOptionValue(field, unknown_fields.get())) {
    return false;  // SetOptionValue() already added the error.
  }

  // Now wrap the UnknownFieldSet with UnknownFieldSets corresponding to all
  // the intermediate messages.
  for (std::vector<const FieldDescriptor*>::reverse_iterator iter =
           intermediate_fields.rbegin();
       iter != intermediate_fields.rend(); ++iter) {
    std::unique_ptr<UnknownFieldSet> parent_unknown_fields(
        new UnknownFieldSet());
    switch ((*iter)->type()) {
      case FieldDescriptor::TYPE_MESSAGE: {
        io::StringOutputStream outstr(
            parent_unknown_fields->AddLengthDelimited((*iter)->number()));
        io::CodedOutputStream out(&outstr);
        internal::WireFormat::SerializeUnknownFields(*unknown_fields, &out);
        GOOGLE_CHECK(!out.HadError())
            << "Unexpected failure while serializing option submessage "
            << debug_msg_name << "\".";
        break;
      }

      case FieldDescriptor::TYPE_GROUP: {
        parent_unknown_fields->AddGroup((*iter)->number())
            ->MergeFrom(*unknown_fields);
        break;
      }

      default:
        GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_MESSAGE: "
                   << (*iter)->type();
        return false;
    }
    unknown_fields.reset(parent_unknown_fields.release());
  }

  // Now merge the UnknownFieldSet corresponding to the top-level message into
  // the options message.
  options->GetReflection()->MutableUnknownFields(options)->MergeFrom(
      *unknown_fields);

  // record the element path of the interpreted option
  if (field->is_repeated()) {
    int index = repeated_option_counts_[dest_path]++;
    dest_path.push_back(index);
  }
  interpreted_paths_[src_path] = dest_path;

  return true;
}